

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::full_formatter::full_formatter(full_formatter *this,padding_info padinfo)

{
  padding_info padinfo_00;
  padding_info padinfo_01;
  undefined8 in_RDX;
  size_t in_RSI;
  flag_formatter *in_RDI;
  allocator<char> *in_stack_ffffffffffffff88;
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *in_stack_ffffffffffffff90;
  size_t sVar1;
  undefined8 uVar2;
  int local_2c [11];
  
  padinfo_01._8_8_ = in_RDX;
  padinfo_01.width_ = in_RSI;
  flag_formatter::flag_formatter(in_RDI,padinfo_01);
  in_RDI->_vptr_flag_formatter = (_func_int **)&PTR__full_formatter_003028c0;
  local_2c[0] = 0;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)(in_RDI + 1),local_2c);
  ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
  basic_memory_buffer(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  sVar1 = 0;
  uVar2._0_4_ = left;
  uVar2._4_1_ = false;
  uVar2._5_1_ = false;
  uVar2._6_2_ = 0;
  padding_info::padding_info((padding_info *)&stack0xffffffffffffffa8);
  padinfo_00.side_ = (pad_side)uVar2;
  padinfo_00.truncate_ = SUB81(uVar2,4);
  padinfo_00.enabled_ = SUB81(uVar2,5);
  padinfo_00._14_2_ = SUB82(uVar2,6);
  padinfo_00.width_ = sVar1;
  mdc_formatter<spdlog::details::null_scoped_padder>::mdc_formatter
            ((mdc_formatter<spdlog::details::null_scoped_padder> *)in_RDI,padinfo_00);
  return;
}

Assistant:

explicit full_formatter(padding_info padinfo)
        : flag_formatter(padinfo) {}